

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<float,_2,_2> __thiscall tcu::operator-(tcu *this,Matrix<float,_2,_2> *mtx,float scalar)

{
  long lVar1;
  int row;
  tcu *ptVar2;
  Matrix<float,_2,_2> *res;
  int col;
  long lVar3;
  bool bVar4;
  undefined4 in_XMM0_Db;
  undefined4 uVar5;
  Matrix<float,_2,_2> MVar6;
  
  MVar6.m_data.m_data[0].m_data[1] = (float)in_XMM0_Db;
  MVar6.m_data.m_data[0].m_data[0] = scalar;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar1 = 0;
  ptVar2 = this;
  do {
    lVar3 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar1 != lVar3) {
        uVar5 = 0;
      }
      *(undefined4 *)(ptVar2 + lVar3 * 8) = uVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    ptVar2 = ptVar2 + 4;
    bVar4 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar4);
  lVar1 = 0;
  do {
    lVar3 = 0;
    do {
      MVar6.m_data.m_data[1].m_data[0] =
           ((Vector<tcu::Vector<float,_2>,_2> *)((Vector<float,_2> *)mtx)->m_data)->m_data[0].m_data
           [lVar3] - scalar;
      *(float *)(this + lVar3 * 4) = MVar6.m_data.m_data[1].m_data[0];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    this = this + 8;
    mtx = (Matrix<float,_2,_2> *)((long)mtx + 8);
    bVar4 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar4);
  MVar6.m_data.m_data[1].m_data[1] = 0.0;
  return (Matrix<float,_2,_2>)MVar6.m_data.m_data;
}

Assistant:

Matrix<T, Rows, Cols> operator- (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) - scalar;
	return res;
}